

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O1

int __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<int>::bind
          (VertexBufferObject<int> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  GLuint GVar1;
  GLenum GVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  
  GVar1 = this->m_vertex_buffer_object_id;
  if (GVar1 != 0) {
    (*this->m_gl->bindBuffer)(this->m_target,GVar1);
    GVar2 = (*this->m_gl->getError)();
    glu::checkError(GVar2,"glBindBuffer call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x174);
    in_RAX = extraout_RAX;
    if (this->m_target == 0x8c8e) {
      (*this->m_gl->bindBufferBase)(0x8c8e,0,this->m_vertex_buffer_object_id);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,"glBindBufferBase call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,0x179);
      in_RAX = extraout_RAX_00;
    }
  }
  return (int)CONCAT71((int7)((ulong)in_RAX >> 8),GVar1 != 0);
}

Assistant:

bool gl3cts::ClipDistance::Utility::VertexBufferObject<T>::bind()
{
	if (m_vertex_buffer_object_id)
	{
		m_gl.bindBuffer(m_target, m_vertex_buffer_object_id);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer call failed.");

		if (m_target == GL_TRANSFORM_FEEDBACK_BUFFER)
		{
			m_gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_vertex_buffer_object_id);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase call failed.");
		}

		return true;
	}

	return false;
}